

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

bool __thiscall TextBuffer::Layer::has_astral(Layer *this)

{
  anon_class_8_1_6971b95b local_30;
  Point local_24;
  Point local_1c;
  bool local_11;
  Layer *pLStack_10;
  bool result;
  Layer *this_local;
  
  local_11 = false;
  pLStack_10 = this;
  Point::Point(&local_1c);
  local_24 = extent(this);
  local_30.result = &local_11;
  for_each_chunk_in_range<TextBuffer::Layer::has_astral()::_lambda(TextSlice)_1_>
            (this,local_1c,local_24,&local_30,false);
  return (bool)(local_11 & 1);
}

Assistant:

bool has_astral() {
    bool result = false;
    for_each_chunk_in_range(Point(), extent(), [&](TextSlice chunk) {
      for (auto ch : chunk) {
        if ((ch & 0xf800) == 0xd800) {
          result = true;
          return true;
        }
      }
      return false;
    });
    return result;
  }